

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCore.c
# Opt level: O2

void If_ManSetDefaultPars(If_Par_t *pPars)

{
  memset(&pPars->nGateSize,0,0x140);
  pPars->nLutSize = -1;
  pPars->nCutsMax = 8;
  pPars->nFlowIters = 1;
  pPars->nAreaIters = 2;
  pPars->DelayTarget = -1.0;
  pPars->Epsilon = 0.005;
  pPars->fPreprocess = 1;
  pPars->fFancy = 0;
  pPars->fExpRed = 1;
  pPars->fEdge = 1;
  pPars->fCutMin = 0;
  pPars->fVerbose = 0;
  return;
}

Assistant:

void If_ManSetDefaultPars( If_Par_t * pPars )
{
    memset( pPars, 0, sizeof(If_Par_t) );
    pPars->nLutSize    = -1;
    pPars->nCutsMax    =  8;
    pPars->nFlowIters  =  1;
    pPars->nAreaIters  =  2;
    pPars->DelayTarget = -1;
    pPars->Epsilon     =  (float)0.005;
    pPars->fPreprocess =  1;
    pPars->fArea       =  0;
    pPars->fFancy      =  0;
    pPars->fExpRed     =  1;
    pPars->fLatchPaths =  0;
    pPars->fEdge       =  1;
    pPars->fPower      =  0;
    pPars->fCutMin     =  0;
    pPars->fBidec      =  0;
    pPars->fVerbose    =  0;
}